

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

uint32_t map_hash_key(JSContext *ctx,JSValue key)

{
  uint in_EDX;
  double in_RSI;
  JSFloat64Union u;
  double d;
  uint32_t h;
  uint32_t tag;
  JSString *in_stack_ffffffffffffffd0;
  double local_28;
  uint local_20;
  uint local_10;
  
  local_10 = SUB84(in_RSI,0);
  switch(in_EDX) {
  case 0:
    local_28 = (double)(int)(local_10 * 0xc5b);
    goto LAB_0017eca9;
  case 1:
    local_20 = local_10;
    break;
  case 7:
    local_28 = in_RSI;
    if (NAN(in_RSI)) {
      local_28 = NAN;
    }
LAB_0017eca9:
    local_20 = (SUB84(local_28,0) ^ (uint)((ulong)local_28 >> 0x20)) * 0xc5b;
    break;
  case 0xfffffff8:
  case 0xffffffff:
    local_20 = local_10 * 0xc5b;
    break;
  case 0xfffffff9:
    local_20 = hash_string(in_stack_ffffffffffffffd0,0);
    break;
  default:
    local_20 = 0;
  }
  return in_EDX ^ local_20;
}

Assistant:

static uint32_t map_hash_key(JSContext *ctx, JSValueConst key)
{
    uint32_t tag = JS_VALUE_GET_NORM_TAG(key);
    uint32_t h;
    double d;
    JSFloat64Union u;

    switch(tag) {
    case JS_TAG_BOOL:
        h = JS_VALUE_GET_INT(key);
        break;
    case JS_TAG_STRING:
        h = hash_string(JS_VALUE_GET_STRING(key), 0);
        break;
    case JS_TAG_OBJECT:
    case JS_TAG_SYMBOL:
        h = (uintptr_t)JS_VALUE_GET_PTR(key) * 3163;
        break;
    case JS_TAG_INT:
        d = JS_VALUE_GET_INT(key) * 3163;
        goto hash_float64;
    case JS_TAG_FLOAT64:
        d = JS_VALUE_GET_FLOAT64(key);
        /* normalize the NaN */
        if (isnan(d))
            d = JS_FLOAT64_NAN;
    hash_float64:
        u.d = d;
        h = (u.u32[0] ^ u.u32[1]) * 3163;
        break;
    default:
        h = 0; /* XXX: bignum support */
        break;
    }
    h ^= tag;
    return h;
}